

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O2

void avro::parsing::add_tests(test_suite *ts)

{
  size_t sVar1;
  TestData4 *in_stack_fffffffffffffdd0;
  param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*> local_228;
  const_string local_1b0;
  char *local_1a0;
  char *local_198;
  const_string local_190;
  char *local_180;
  char *local_178;
  const_string local_170;
  char *local_160;
  char *local_158;
  const_string local_150;
  char *local_140;
  char *local_138;
  const_string local_130;
  char *local_120;
  char *local_118;
  const_string local_110;
  char *local_100;
  char *local_f8;
  const_string local_f0;
  char *local_e0;
  char *local_d8;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  char *local_a0;
  char *local_98;
  const_string local_90;
  char *local_80;
  char *local_78;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  char *local_40;
  char *local_38;
  
  local_40 = "testWithData(&testCodec<BinaryCodecFactory>, data)";
  local_38 = "";
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_50.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228,(unit_test *)testCodec<avro::parsing::BinaryCodecFactory>,
             (_func_void_TestData_ptr *)&local_40,&local_50,(const_string *)0x590,0x1e1450,
             (TestData *)data2,(TestData *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228);
  local_60 = "testWithData(&testCodec<ValidatingCodecFactory>, data)";
  local_58 = "";
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_70.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228,(unit_test *)testCodec<avro::parsing::ValidatingCodecFactory>,
             (_func_void_TestData_ptr *)&local_60,&local_70,(const_string *)0x591,0x1e1450,
             (TestData *)data2,(TestData *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228);
  local_80 = "testWithData(&testCodec<JsonCodec>, data)";
  local_78 = "";
  local_90.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_90.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228,(unit_test *)testCodec<avro::parsing::JsonCodec>,
             (_func_void_TestData_ptr *)&local_80,&local_90,(const_string *)0x592,0x1e1450,
             (TestData *)data2,(TestData *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228);
  local_a0 = "testWithData(&testCodec<BinaryEncoderResolvingDecoderFactory>, data)";
  local_98 = "";
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_b0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228,(unit_test *)testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>,
             (_func_void_TestData_ptr *)&local_a0,&local_b0,(const_string *)0x593,0x1e1450,
             (TestData *)data2,(TestData *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228);
  local_c0 = "testWithData(&testReaderFail<ValidatingCodecFactory>, data2)";
  local_b8 = "";
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_d0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData2_const&,avro::parsing::TestData2_const*>
            (&local_228,(unit_test *)testReaderFail<avro::parsing::ValidatingCodecFactory>,
             (_func_void_TestData2_ptr *)&local_c0,&local_d0,(const_string *)0x594,0x1e1c00,
             (TestData2 *)data3,(TestData2 *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*>::
  ~param_test_case_generator(&local_228);
  local_e0 = "testWithData(&testWriterFail<ValidatingCodecFactory>, data2)";
  local_d8 = "";
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_f0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData2_const&,avro::parsing::TestData2_const*>
            (&local_228,(unit_test *)testWriterFail<avro::parsing::ValidatingCodecFactory>,
             (_func_void_TestData2_ptr *)&local_e0,&local_f0,(const_string *)0x595,0x1e1c00,
             (TestData2 *)data3,(TestData2 *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*>::
  ~param_test_case_generator(&local_228);
  local_100 = "testWithData(&testCodecResolving<BinaryEncoderResolvingDecoderFactory>, data3)";
  local_f8 = "";
  local_110.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_110.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData3_const&,avro::parsing::TestData3_const*>
            ((param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>
              *)&local_228,
             (unit_test *)testCodecResolving<avro::parsing::BinaryEncoderResolvingDecoderFactory>,
             (_func_void_TestData3_ptr *)&local_100,&local_110,(const_string *)0x597,0x1e1d60,
             (TestData3 *)jsonData,(TestData3 *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>
              *)&local_228);
  local_120 = "testWithData(&testCodecResolving2<BinaryEncoderResolvingDecoderFactory>, data4)";
  local_118 = "";
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_130.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData4_const&,avro::parsing::TestData4_const*>
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_228,
             (unit_test *)testCodecResolving2<avro::parsing::BinaryEncoderResolvingDecoderFactory>,
             (_func_void_TestData4_ptr *)&local_120,&local_130,(const_string *)0x599,0x1e2d70,
             (TestData4 *)&DAT_001ead90,in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_228);
  local_140 = "testWithData(&testCodecResolving2<ValidatingEncoderResolvingDecoderFactory>, data4)";
  local_138 = "";
  local_150.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_150.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData4_const&,avro::parsing::TestData4_const*>
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_228,
             (unit_test *)
             testCodecResolving2<avro::parsing::ValidatingEncoderResolvingDecoderFactory>,
             (_func_void_TestData4_ptr *)&local_140,&local_150,(const_string *)0x59b,0x1e2d70,
             (TestData4 *)&DAT_001ead90,in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_228);
  local_160 = "testWithData(&testGeneric<ValidatingCodecFactory>, data)";
  local_158 = "";
  local_170.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_170.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228,(unit_test *)testGeneric<avro::parsing::ValidatingCodecFactory>,
             (_func_void_TestData_ptr *)&local_160,&local_170,(const_string *)0x59d,0x1e1450,
             (TestData *)data2,(TestData *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_228);
  local_180 = "testWithData(&testGenericResolving<ValidatingCodecFactory>, data3)";
  local_178 = "";
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_190.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData3_const&,avro::parsing::TestData3_const*>
            ((param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>
              *)&local_228,(unit_test *)testGenericResolving<avro::parsing::ValidatingCodecFactory>,
             (_func_void_TestData3_ptr *)&local_180,&local_190,(const_string *)0x59e,0x1e1d60,
             (TestData3 *)jsonData,(TestData3 *)in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>
              *)&local_228);
  local_1a0 = "testWithData(&testGenericResolving2<ValidatingCodecFactory>, data4)";
  local_198 = "";
  local_1b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                    );
  local_1b0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::parsing::TestData4_const&,avro::parsing::TestData4_const*>
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_228,(unit_test *)testGenericResolving2<avro::parsing::ValidatingCodecFactory>
             ,(_func_void_TestData4_ptr *)&local_1a0,&local_1b0,(const_string *)0x59f,0x1e2d70,
             (TestData4 *)&DAT_001ead90,in_stack_fffffffffffffdd0);
  boost::unit_test::test_suite::add(ts,&local_228.super_test_unit_generator,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_228);
  return;
}

Assistant:

void add_tests(boost::unit_test::test_suite& ts)
{
    ADD_TESTS(ts, BinaryCodecFactory, testCodec, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testCodec, data);
    ADD_TESTS(ts, JsonCodec, testCodec, data);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory, testCodec, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testReaderFail, data2);
    ADD_TESTS(ts, ValidatingCodecFactory, testWriterFail, data2);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory,
        testCodecResolving, data3);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory,
        testCodecResolving2, data4);
    ADD_TESTS(ts, ValidatingEncoderResolvingDecoderFactory,
        testCodecResolving2, data4);

    ADD_TESTS(ts, ValidatingCodecFactory, testGeneric, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testGenericResolving, data3);
    ADD_TESTS(ts, ValidatingCodecFactory, testGenericResolving2, data4);
}